

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O1

object * chest_check(player *p,loc grid,chest_query check_type)

{
  short sVar1;
  _Bool _Var2;
  object *obj;
  
  obj = square_object(cave,grid);
  do {
    if (obj == (object *)0x0) {
      return (object *)0x0;
    }
    _Var2 = ignore_item_ok(p,obj);
    if (!_Var2) {
      if (check_type == CHEST_TRAPPED) {
        _Var2 = tval_is_chest(obj);
        if (((_Var2) && (1 < obj->pval)) && (obj->known != (object *)0x0)) {
          sVar1 = obj->known->pval;
joined_r0x0017bcd1:
          if (sVar1 != 0) {
            return obj;
          }
        }
      }
      else if (check_type == CHEST_OPENABLE) {
        _Var2 = tval_is_chest(obj);
        if (_Var2) {
          sVar1 = obj->pval;
          goto joined_r0x0017bcd1;
        }
      }
      else if ((check_type == CHEST_ANY) && (_Var2 = tval_is_chest(obj), _Var2)) {
        return obj;
      }
    }
    obj = obj->next;
  } while( true );
}

Assistant:

struct object *chest_check(const struct player *p, struct loc grid,
		enum chest_query check_type)
{
	struct object *obj;

	/* Scan all objects in the grid */
	for (obj = square_object(cave, grid); obj; obj = obj->next) {
		/* Ignore if requested */
		if (ignore_item_ok(p, obj)) continue;

		/* Check for chests */
		switch (check_type) {
		case CHEST_ANY:
			if (tval_is_chest(obj))
				return obj;
			break;
		case CHEST_OPENABLE:
			if (tval_is_chest(obj) && (obj->pval != 0))
				return obj;
			break;
		case CHEST_TRAPPED:
			if (is_trapped_chest(obj) && obj->known && obj->known->pval)
				return obj;
			break;
		}
	}

	/* No chest */
	return NULL;
}